

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O0

void __thiscall avro::EnumSchema::EnumSchema(EnumSchema *this,string *name)

{
  Name *name_00;
  Name *in_RDI;
  Node *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffffa8;
  Name *in_stack_ffffffffffffffb0;
  
  operator_new(0xa8);
  NodeEnum::NodeEnum((NodeEnum *)in_RDI);
  Schema::Schema((Schema *)in_RDI,in_stack_ffffffffffffff88);
  *(undefined ***)&in_RDI->ns_ = &PTR__EnumSchema_00236458;
  name_00 = (Name *)boost::shared_ptr<avro::Node>::operator->
                              ((NodePtr *)&(in_RDI->ns_)._M_string_length);
  Name::Name(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Node::setName((Node *)in_RDI,name_00);
  Name::~Name(in_RDI);
  return;
}

Assistant:

EnumSchema::EnumSchema(const std::string &name) :
    Schema(new NodeEnum)
{
    node_->setName(name);
}